

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
          (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this)

{
  memory_resource *pmVar1;
  
  this->nStored = 0;
  pmVar1 = (this->alloc).memoryResource;
  (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 2,4);
  return;
}

Assistant:

~InlinedVector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }